

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.h
# Opt level: O0

void SpookyHash::ShortEnd(uint64 *h0,uint64 *h1,uint64 *h2,uint64 *h3)

{
  uint64 uVar1;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  
  *in_RCX = *in_RDX ^ *in_RCX;
  uVar1 = Rot64(*in_RDX,0xf);
  *in_RDX = uVar1;
  *in_RCX = *in_RDX + *in_RCX;
  *in_RDI = *in_RCX ^ *in_RDI;
  uVar1 = Rot64(*in_RCX,0x34);
  *in_RCX = uVar1;
  *in_RDI = *in_RCX + *in_RDI;
  *in_RSI = *in_RDI ^ *in_RSI;
  uVar1 = Rot64(*in_RDI,0x1a);
  *in_RDI = uVar1;
  *in_RSI = *in_RDI + *in_RSI;
  *in_RDX = *in_RSI ^ *in_RDX;
  uVar1 = Rot64(*in_RSI,0x33);
  *in_RSI = uVar1;
  *in_RDX = *in_RSI + *in_RDX;
  *in_RCX = *in_RDX ^ *in_RCX;
  uVar1 = Rot64(*in_RDX,0x1c);
  *in_RDX = uVar1;
  *in_RCX = *in_RDX + *in_RCX;
  *in_RDI = *in_RCX ^ *in_RDI;
  uVar1 = Rot64(*in_RCX,9);
  *in_RCX = uVar1;
  *in_RDI = *in_RCX + *in_RDI;
  *in_RSI = *in_RDI ^ *in_RSI;
  uVar1 = Rot64(*in_RDI,0x2f);
  *in_RDI = uVar1;
  *in_RSI = *in_RDI + *in_RSI;
  *in_RDX = *in_RSI ^ *in_RDX;
  uVar1 = Rot64(*in_RSI,0x36);
  *in_RSI = uVar1;
  *in_RDX = *in_RSI + *in_RDX;
  *in_RCX = *in_RDX ^ *in_RCX;
  uVar1 = Rot64(*in_RDX,0x20);
  *in_RDX = uVar1;
  *in_RCX = *in_RDX + *in_RCX;
  *in_RDI = *in_RCX ^ *in_RDI;
  uVar1 = Rot64(*in_RCX,0x19);
  *in_RCX = uVar1;
  *in_RDI = *in_RCX + *in_RDI;
  *in_RSI = *in_RDI ^ *in_RSI;
  uVar1 = Rot64(*in_RDI,0x3f);
  *in_RDI = uVar1;
  *in_RSI = *in_RDI + *in_RSI;
  return;
}

Assistant:

static INLINE void ShortEnd(uint64 &h0, uint64 &h1, uint64 &h2, uint64 &h3)
    {
        h3 ^= h2;  h2 = Rot64(h2,15);  h3 += h2;
        h0 ^= h3;  h3 = Rot64(h3,52);  h0 += h3;
        h1 ^= h0;  h0 = Rot64(h0,26);  h1 += h0;
        h2 ^= h1;  h1 = Rot64(h1,51);  h2 += h1;
        h3 ^= h2;  h2 = Rot64(h2,28);  h3 += h2;
        h0 ^= h3;  h3 = Rot64(h3,9);   h0 += h3;
        h1 ^= h0;  h0 = Rot64(h0,47);  h1 += h0;
        h2 ^= h1;  h1 = Rot64(h1,54);  h2 += h1;
        h3 ^= h2;  h2 = Rot64(h2,32);  h3 += h2;
        h0 ^= h3;  h3 = Rot64(h3,25);  h0 += h3;
        h1 ^= h0;  h0 = Rot64(h0,63);  h1 += h0;
    }